

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ghosts.c
# Opt level: O1

void pnga_get_ghost_block(Integer g_a,Integer *lo,Integer *hi,void *buf,Integer *ld)

{
  short sVar1;
  long lVar2;
  char *pcVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  Integer proc;
  long lVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  int stride_loc [7];
  int stride_rem [7];
  int count [7];
  Integer llo [7];
  Integer ghi [7];
  Integer glo [7];
  Integer ldrem [7];
  int local_188 [8];
  int local_168 [8];
  int local_148 [6];
  long alStack_130 [9];
  Integer local_e8 [8];
  Integer local_a8 [8];
  long alStack_68 [7];
  
  lVar7 = g_a + 1000;
  proc = GAme;
  if (0 < (long)GA[g_a + 1000].p_handle) {
    proc = (Integer)PGRP_LIST[GA[g_a + 1000].p_handle].map_proc_list[GAme];
  }
  sVar1 = GA[lVar7].ndim;
  lVar8 = (long)sVar1;
  pnga_distribution(g_a,proc,local_a8,local_e8);
  if (0 < lVar8) {
    bVar4 = true;
    lVar11 = 0;
    do {
      lVar9 = local_a8[lVar11];
      lVar10 = GA[g_a + 1000].width[lVar11];
      lVar13 = lVar9 - lVar10;
      lVar12 = local_e8[lVar11];
      if (lo[lVar11] < lVar13) {
        bVar4 = false;
      }
      if (lVar12 + lVar10 < hi[lVar11]) {
        bVar4 = false;
      }
      alStack_130[lVar11 + 1] = lVar13;
      if (lVar11 < lVar8 + -1) {
        alStack_68[lVar11] = (lVar10 * 2 - lVar9) + lVar12 + 1;
      }
      lVar11 = lVar11 + 1;
    } while (lVar8 != lVar11);
    if (!bVar4) {
      pnga_periodic(g_a,lo,hi,buf,ld,(void *)0x0,1);
      return;
    }
  }
  iVar5 = GA[lVar7].elemsize;
  lVar9 = (long)iVar5;
  lVar11 = lVar8 + -1;
  if (sVar1 < 2) {
    lVar10 = 1;
    lVar12 = 0;
  }
  else {
    lVar10 = 1;
    lVar13 = 0;
    lVar12 = 0;
    do {
      lVar12 = lVar12 + (lo[lVar13] - alStack_130[lVar13 + 1]) * lVar10;
      lVar10 = lVar10 * ((local_e8[lVar13] - local_a8[lVar13]) + GA[g_a + 1000].width[lVar13] * 2 +
                        1);
      lVar13 = lVar13 + 1;
    } while (lVar11 != lVar13);
  }
  lVar13 = lo[lVar8 + -1];
  lVar2 = alStack_130[lVar8];
  pcVar3 = GA[lVar7].ptr[proc];
  if (0 < sVar1) {
    lVar7 = 0;
    do {
      local_148[lVar7] = ((int)hi[lVar7] - (int)lo[lVar7]) + 1;
      lVar7 = lVar7 + 1;
    } while (lVar8 != lVar7);
  }
  local_148[0] = local_148[0] * iVar5;
  local_188[0] = iVar5;
  local_168[0] = iVar5;
  if (1 < sVar1) {
    lVar7 = 0;
    iVar6 = iVar5;
    do {
      iVar6 = iVar6 * (int)alStack_68[lVar7];
      local_168[lVar7] = iVar6;
      iVar5 = iVar5 * (int)ld[lVar7];
      local_188[lVar7] = iVar5;
      local_168[lVar7 + 1] = iVar6;
      local_188[lVar7 + 1] = iVar5;
      lVar7 = lVar7 + 1;
    } while (lVar11 != lVar7);
  }
  ARMCI_GetS(pcVar3 + ((lVar13 - lVar2) * lVar10 + lVar12) * lVar9,local_168,buf,local_188,local_148
             ,(int)lVar11,(int)proc);
  return;
}

Assistant:

void pnga_get_ghost_block(Integer g_a,
                               Integer *lo,
                               Integer *hi,
                               void *buf,
                               Integer *ld)
{
  /* g_a:      Global array handle
     lo[]:     Array of lower indices of patch of global array
     hi[]:     Array of upper indices of patch of global array
     buf[]:    Local buffer that array patch will be copied into
     ld[]:     Array of physical ndim-1 dimensions of local buffer */
  Integer handle=GA_OFFSET + g_a, ndim;
  Integer i, glo[MAXDIM], ghi[MAXDIM], ichk, me, grp_id;
  Integer llo[MAXDIM];
  int  stride_rem[MAXDIM], stride_loc[MAXDIM], count[MAXDIM];
  Integer ldrem[MAXDIM];
  Integer offset, factor, size;
  char *ptr;

  me = GAme;
  grp_id = (Integer)GA[handle].p_handle;
  if (grp_id>0) me = PGRP_LIST[grp_id].map_proc_list[me];
  ndim = GA[handle].ndim;

  /* Figure out whether or not lo and hi can be accessed completely
     from local data */
  pnga_distribution(g_a, me, glo, ghi);
  ichk = 1;
  for (i=0; i<ndim; i++) {
    if (lo[i] < glo[i]-(Integer)GA[handle].width[i]) ichk = 0;
    if (hi[i] > ghi[i]+(Integer)GA[handle].width[i]) ichk = 0;
    llo[i] = glo[i] - (Integer)GA[handle].width[i];
    if (i<ndim-1) ldrem[i] = ghi[i] - glo[i] + 1
      + 2*(Integer)GA[handle].width[i];
  }

  /* Get data. Use local copy if possible, otherwise use a periodic get */
  if (ichk) {
    offset = 0;
    factor = 1;
    size = GA[handle].elemsize;
    for (i=0; i<ndim-1; i++) {
      offset += (lo[i]-llo[i])*factor;
      factor *= ghi[i] - glo[i] + 1 + 2*(Integer)GA[handle].width[i];
    }
    offset += (lo[ndim-1]-llo[ndim-1])*factor;
    ptr = GA[handle].ptr[me] + size*offset;
    /* compute number of elements in each dimension and store result in count */
    gam_ComputeCount(ndim, lo, hi, count);

    /* scale first element in count by element size. The ARMCI_GetS
       routine uses this convention to figure out memory sizes.*/
    count[0] *= size;

    /* Return strides for memory containing global array on remote
       processor indexed by proc (stride_rem) and for local buffer
       buf (stride_loc) */
    gam_setstride(ndim, size, ld, ldrem, stride_rem, stride_loc);
    ARMCI_GetS(ptr,stride_rem,buf,stride_loc,count,ndim-1,me);
  } else {
    pnga_periodic(g_a,lo,hi,buf,ld,NULL,PERIODIC_GET);
  }
}